

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

opj_bool jp2_read_cmap_v2(opj_jp2_v2_t *jp2,uchar *p_cmap_header_data,OPJ_UINT32 p_cmap_header_size,
                         opj_event_mgr_t *p_manager)

{
  OPJ_BYTE *p_buffer;
  opj_jp2_pclr_t *poVar1;
  opj_jp2_cmap_comp_t *poVar2;
  char *fmt;
  size_t __size;
  size_t sVar3;
  OPJ_UINT32 l_value;
  opj_jp2_v2_t *local_40;
  uchar *local_38;
  
  poVar1 = (jp2->color).jp2_pclr;
  local_38 = p_cmap_header_data;
  if (poVar1 == (opj_jp2_pclr_t *)0x0) {
    fmt = "Need to read a PCLR box before the CMAP box.\n";
  }
  else {
    if (poVar1->cmap == (opj_jp2_cmap_comp_t *)0x0) {
      __size = (ulong)(byte)poVar1->nr_channels * 4;
      local_40 = jp2;
      poVar2 = (opj_jp2_cmap_comp_t *)malloc(__size);
      for (sVar3 = 0; __size != sVar3; sVar3 = sVar3 + 4) {
        p_buffer = local_38 + sVar3;
        opj_read_bytes_LE(p_buffer,&l_value,2);
        *(undefined2 *)((long)&poVar2->cmp + sVar3) = (undefined2)l_value;
        opj_read_bytes_LE(p_buffer + 2,&l_value,1);
        (&poVar2->mtyp)[sVar3] = (uchar)l_value;
        opj_read_bytes_LE(p_buffer + 3,&l_value,1);
        (&poVar2->pcol)[sVar3] = (uchar)l_value;
      }
      ((local_40->color).jp2_pclr)->cmap = poVar2;
      return 1;
    }
    fmt = "Only one CMAP box is allowed.\n";
  }
  opj_event_msg_v2(p_manager,1,fmt);
  return 0;
}

Assistant:

static opj_bool jp2_read_cmap_v2(	opj_jp2_v2_t * jp2,
							unsigned char * p_cmap_header_data,
							OPJ_UINT32 p_cmap_header_size,
							opj_event_mgr_t * p_manager
						  )
{
	opj_jp2_cmap_comp_t *cmap;
	OPJ_BYTE i, nr_channels;
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(jp2 != 00);
	assert(p_cmap_header_data != 00);
	assert(p_manager != 00);

	/* Need nr_channels: */
	if(jp2->color.jp2_pclr == NULL) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Need to read a PCLR box before the CMAP box.\n");
		return OPJ_FALSE;
	}

	/* Part 1, I.5.3.5: 'There shall be at most one Component Mapping box
	 * inside a JP2 Header box' :
	*/
	if(jp2->color.jp2_pclr->cmap) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Only one CMAP box is allowed.\n");
		return OPJ_FALSE;
	}

	nr_channels = jp2->color.jp2_pclr->nr_channels;
	cmap = (opj_jp2_cmap_comp_t*) opj_malloc(nr_channels * sizeof(opj_jp2_cmap_comp_t));

	for(i = 0; i < nr_channels; ++i) {
		opj_read_bytes(p_cmap_header_data, &l_value, 2);			/* CMP^i */
		p_cmap_header_data +=2;
		cmap[i].cmp = (OPJ_UINT16) l_value;

		opj_read_bytes(p_cmap_header_data, &l_value, 1);			/* MTYP^i */
		++p_cmap_header_data;
		cmap[i].mtyp = (OPJ_BYTE) l_value;

		opj_read_bytes(p_cmap_header_data, &l_value, 1);			/* PCOL^i */
		++p_cmap_header_data;
		cmap[i].pcol = (OPJ_BYTE) l_value;
	}

	jp2->color.jp2_pclr->cmap = cmap;

	return OPJ_TRUE;
}